

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_heat1D_adapt.c
# Opt level: O0

int f(sunrealtype t,N_Vector y,N_Vector ydot,void *user_data)

{
  double dVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  long *in_RDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  sunindextype i;
  sunrealtype dxR;
  sunrealtype dxL;
  sunrealtype *Ydot;
  sunrealtype *Y;
  sunrealtype *x;
  sunrealtype k;
  sunindextype N;
  UserData udata;
  int in_stack_ffffffffffffff6c;
  char *in_stack_ffffffffffffff70;
  void *in_stack_ffffffffffffff78;
  long local_70;
  int local_4;
  
  lVar2 = *in_RDX;
  dVar1 = (double)in_RDX[2];
  lVar3 = in_RDX[1];
  lVar5 = N_VGetArrayPointer(in_RDI);
  iVar4 = check_flag(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
  if (iVar4 == 0) {
    lVar6 = N_VGetArrayPointer(in_RSI);
    iVar4 = check_flag(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c
                      );
    if (iVar4 == 0) {
      N_VConst(0,in_RSI);
      for (local_70 = 1; local_70 < lVar2 + -1; local_70 = local_70 + 1) {
        dVar7 = *(double *)(lVar3 + local_70 * 8) - *(double *)(lVar3 + (local_70 + -1) * 8);
        dVar8 = *(double *)(lVar3 + 8 + local_70 * 8) - *(double *)(lVar3 + local_70 * 8);
        dVar8 = ((*(double *)(lVar5 + (local_70 + -1) * 8) * dVar1 * 2.0) /
                 (dVar7 * (dVar7 + dVar8)) -
                (*(double *)(lVar5 + local_70 * 8) * dVar1 * 2.0) / (dVar7 * dVar8)) +
                (*(double *)(lVar5 + 8 + local_70 * 8) * dVar1 * 2.0) / (dVar8 * (dVar7 + dVar8));
        dVar7 = exp((*(double *)(lVar3 + local_70 * 8) - 0.25) * -200.0 *
                    (*(double *)(lVar3 + local_70 * 8) - 0.25));
        dVar8 = dVar7 + dVar7 + dVar8;
        dVar7 = exp((*(double *)(lVar3 + local_70 * 8) - 0.7) * -400.0 *
                    (*(double *)(lVar3 + local_70 * 8) - 0.7));
        dVar9 = exp((*(double *)(lVar3 + local_70 * 8) - 0.4) * -500.0 *
                    (*(double *)(lVar3 + local_70 * 8) - 0.4));
        dVar10 = exp((*(double *)(lVar3 + local_70 * 8) - 0.55) * -600.0 *
                     (*(double *)(lVar3 + local_70 * 8) - 0.55));
        *(double *)(lVar6 + local_70 * 8) = ((dVar8 - dVar7) + dVar9) - (dVar10 + dVar10);
      }
      local_4 = 0;
    }
    else {
      local_4 = 1;
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int f(sunrealtype t, N_Vector y, N_Vector ydot, void* user_data)
{
  UserData udata = (UserData)user_data; /* access problem data */
  sunindextype N = udata->N;            /* set variable shortcuts */
  sunrealtype k  = udata->k;
  sunrealtype* x = udata->x;
  sunrealtype *Y = NULL, *Ydot = NULL;
  sunrealtype dxL, dxR;
  sunindextype i;

  /* access data arrays */
  Y = N_VGetArrayPointer(y);
  if (check_flag((void*)Y, "N_VGetArrayPointer", 0)) { return 1; }
  Ydot = N_VGetArrayPointer(ydot);
  if (check_flag((void*)Ydot, "N_VGetArrayPointer", 0)) { return 1; }

  /* Initialize ydot to zero - also handles boundary conditions */
  N_VConst(ZERO, ydot);

  /* iterate over domain interior, computing all equations */
  for (i = 1; i < N - 1; i++)
  { /* interior */
    dxL = x[i] - x[i - 1];
    dxR = x[i + 1] - x[i];
    Ydot[i] =
      Y[i - 1] * k * TWO / (dxL * (dxL + dxR)) - Y[i] * k * TWO / (dxL * dxR) +
      Y[i + 1] * k * TWO / (dxR * (dxL + dxR)) +
      TWO * exp(-TWOHUNDRED * (x[i] - PT25) * (x[i] - PT25)) /* source term */
      - exp(-FOURHUNDRED * (x[i] - PT7) * (x[i] - PT7)) +
      exp(-FIVEHUNDRED * (x[i] - PT4) * (x[i] - PT4)) -
      TWO * exp(-SIXHUNDRED * (x[i] - PT55) * (x[i] - PT55));
  }

  return 0; /* Return with success */
}